

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayoutitem.cpp
# Opt level: O0

void __thiscall QGraphicsLayoutItem::~QGraphicsLayoutItem(QGraphicsLayoutItem *this)

{
  bool bVar1;
  int iVar2;
  QGraphicsLayoutItem *pQVar3;
  undefined4 extraout_var;
  undefined8 *in_RDI;
  int i;
  QGraphicsLayout *lay;
  QGraphicsLayoutItem *parentLI;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  
  *in_RDI = &PTR__QGraphicsLayoutItem_00d33e60;
  pQVar3 = parentLayoutItem((QGraphicsLayoutItem *)0x9b5019);
  if ((pQVar3 != (QGraphicsLayoutItem *)0x0) &&
     (bVar1 = isLayout((QGraphicsLayoutItem *)0x9b5030), bVar1)) {
    in_stack_ffffffffffffffe4 = (*pQVar3->_vptr_QGraphicsLayoutItem[9])();
    do {
      in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 - 1;
      if ((int)in_stack_ffffffffffffffe4 < 0) goto LAB_009b5093;
      iVar2 = (*pQVar3->_vptr_QGraphicsLayoutItem[10])(pQVar3,(ulong)in_stack_ffffffffffffffe4);
    } while ((undefined8 *)CONCAT44(extraout_var,iVar2) != in_RDI);
    (*pQVar3->_vptr_QGraphicsLayoutItem[0xb])(pQVar3,(ulong)in_stack_ffffffffffffffe4);
  }
LAB_009b5093:
  QScopedPointer<QGraphicsLayoutItemPrivate,_QScopedPointerDeleter<QGraphicsLayoutItemPrivate>_>::
  ~QScopedPointer((QScopedPointer<QGraphicsLayoutItemPrivate,_QScopedPointerDeleter<QGraphicsLayoutItemPrivate>_>
                   *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  return;
}

Assistant:

QGraphicsLayoutItem::~QGraphicsLayoutItem()
{
    QGraphicsLayoutItem *parentLI = parentLayoutItem();
    if (parentLI && parentLI->isLayout()) {
        QGraphicsLayout *lay = static_cast<QGraphicsLayout*>(parentLI);
        // this is not optimal
        for (int i = lay->count() - 1; i >= 0; --i) {
            if (lay->itemAt(i) == this) {
                lay->removeAt(i);
                break;
            }
        }
    }
}